

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExternalMakefileProjectGenerator.h
# Opt level: O3

void __thiscall
cmExternalMakefileProjectGenerator::~cmExternalMakefileProjectGenerator
          (cmExternalMakefileProjectGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  this->_vptr_cmExternalMakefileProjectGenerator =
       (_func_int **)&PTR__cmExternalMakefileProjectGenerator_00667300;
  pcVar2 = (this->Name)._M_dataplus._M_p;
  paVar1 = &(this->Name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->SupportedGlobalGenerators);
  return;
}

Assistant:

virtual ~cmExternalMakefileProjectGenerator() {}